

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfHiResTimer.c
# Opt level: O0

sbfHiResTimer sbfHiResTimer_create(sbfQueue queue,sbfHiResTimerCb cb,void *closure,u_int interval)

{
  sbfHiResTimer psVar1;
  uint64_t uVar2;
  u_int in_ECX;
  void *in_RDX;
  sbfHiResTimerImpl *in_RSI;
  sbfQueue in_RDI;
  sbfHiResTimer timer;
  
  psVar1 = (sbfHiResTimer)sbfMemory_malloc(0x60);
  psVar1->mQueue = in_RDI;
  psVar1->mInterval = in_ECX;
  uVar2 = sbfPerfCounter_ticks((double)psVar1->mInterval);
  psVar1->mTicks = uVar2;
  uVar2 = sbfPerfCounter_get();
  psVar1->mNext = uVar2 + psVar1->mTicks;
  psVar1->mCb = (sbfHiResTimerCb)in_RSI;
  psVar1->mClosure = in_RDX;
  psVar1->mDestroyed = 0;
  sbfRefCount_init(&psVar1->mRefCount,1);
  sbfLog_log(psVar1->mQueue->mLog,0,"creating hi-res timer %p: interval %u microseconds",psVar1,
             psVar1->mInterval);
  sbfHiResTimerTreeImpl_RB_INSERT((sbfHiResTimerTreeImpl *)in_RDI,in_RSI);
  return psVar1;
}

Assistant:

sbfHiResTimer
sbfHiResTimer_create (sbfQueue queue,
                      sbfHiResTimerCb cb,
                      void* closure,
                      u_int interval)
{
    sbfHiResTimer timer;

    timer = xmalloc (sizeof *timer);
    timer->mQueue = queue;

    timer->mInterval = interval;

    timer->mTicks = sbfPerfCounter_ticks (timer->mInterval);
    timer->mNext = sbfPerfCounter_get () + timer->mTicks;

    timer->mCb = cb;
    timer->mClosure = closure;

    timer->mDestroyed = 0;
    sbfRefCount_init (&timer->mRefCount, 1);

    sbfLog_debug (timer->mQueue->mLog,
                  "creating hi-res timer %p: interval %u microseconds",
                  timer,
                  timer->mInterval);

    RB_INSERT (sbfHiResTimerTreeImpl, &queue->mHiResTimers, timer);

    return timer;
}